

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::unhandled(parser *this,char *function,int line)

{
  ostream *poVar1;
  token *t;
  runtime_error *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream oss;
  int line_local;
  char *function_local;
  parser *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Unhandled token in ");
  poVar1 = std::operator<<(poVar1,function);
  poVar1 = std::operator<<(poVar1," line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1," ");
  t = current_token(this);
  mjs::operator<<(poVar1,t);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void unhandled(const char* function, int line) {
        std::ostringstream oss;
        oss << "Unhandled token in " << function  << " line " << line << " " << current_token();
        throw std::runtime_error(oss.str());
    }